

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_auto_vscroll(osgen_txtwin_t *win)

{
  size_t in_RDI;
  
  if (((*(uint *)(in_RDI + 4) & 1) != 0) &&
     (*(int *)(in_RDI + 0x5c) + (int)*(undefined8 *)(in_RDI + 0x40) <= *(int *)(in_RDI + 0x4c))) {
    osgen_scroll_win_fwd(win,in_RDI);
  }
  return;
}

Assistant:

static void osgen_auto_vscroll(osgen_txtwin_t *win)
{
    /* if the window isn't in auto-vscroll mode, ignore this */
    if (!(win->base.flags & OSGEN_AUTO_VSCROLL))
        return;
    
    /* 
     *   scroll the window forward if the cursor is outside the visible area
     *   of the window 
     */
    if (win->base.y >= win->base.scrolly + (int)win->base.ht)
        osgen_scroll_win_fwd(win, win->base.y
                             - (win->base.scrolly + win->base.ht) + 1);
}